

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O0

void __thiscall
FunctionDeclarationNode::FunctionDeclarationNode
          (FunctionDeclarationNode *this,string *name,TypeName *returnType,
          list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
          *args,unique_ptr<BlockNode,_std::default_delete<BlockNode>_> *body)

{
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *in_RCX;
  undefined4 *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *in_R8;
  unique_ptr<BlockNode,_std::default_delete<BlockNode>_> *in_stack_ffffffffffffff98;
  StatementNode *in_stack_ffffffffffffffa0;
  shared_ptr<BlockNode> *this_00;
  
  StatementNode::StatementNode(in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__FunctionDeclarationNode_002b1d58;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  *(undefined4 *)(in_RDI + 6) = *in_RDX;
  this_00 = (shared_ptr<BlockNode> *)(in_RDI + 7);
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::list(in_RCX,in_R8);
  std::shared_ptr<BlockNode>::shared_ptr<BlockNode,std::default_delete<BlockNode>,void>
            (this_00,in_stack_ffffffffffffff98);
  return;
}

Assistant:

FunctionDeclarationNode(const std::string& name, const TypeName& returnType, 
    const std::list<std::pair<std::string, TypeName>> args, std::unique_ptr<BlockNode> body):
      name_(name), returnType_(returnType), arguments_(args), body_(std::move(body)) {}